

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntensityILS.cpp
# Opt level: O1

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
imrt::IntensityILS::getShuffledCells
          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           *__return_storage_ptr__,IntensityILS *this,Station *s)

{
  pointer *pppVar1;
  double dVar2;
  iterator __position;
  pointer ppVar3;
  pointer ppVar4;
  int iVar5;
  pair<int,_int> in_RAX;
  pointer ppVar6;
  pair<int,_int> pVar7;
  pair<int,_int> pVar8;
  ulong uVar9;
  long lVar10;
  pair<int,_int> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = in_RAX;
  if (0 < (s->I).rows_) {
    pVar8.first = 0;
    pVar8.second = 0;
    do {
      if (0 < (s->I).cols_) {
        lVar10 = 0;
        pVar7 = pVar8;
        do {
          dVar2 = (s->I).p[(long)pVar8][lVar10];
          if ((dVar2 != -1.0) || (NAN(dVar2))) {
            __position._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            local_38 = pVar7;
            if (__position._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              _M_realloc_insert<std::pair<int,int>>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                         __return_storage_ptr__,__position,&local_38);
            }
            else {
              *__position._M_current = pVar7;
              pppVar1 = &(__return_storage_ptr__->
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *pppVar1 = *pppVar1 + 1;
            }
          }
          lVar10 = lVar10 + 1;
          pVar7 = (pair<int,_int>)((long)pVar7 + 0x100000000);
        } while (lVar10 < (s->I).cols_);
      }
      pVar8 = (pair<int,_int>)((long)pVar8 + 1);
    } while ((long)pVar8 < (long)(s->I).rows_);
  }
  ppVar3 = (__return_storage_ptr__->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  ppVar4 = (__return_storage_ptr__->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((ppVar3 != ppVar4) && (ppVar3 + 1 != ppVar4)) {
    uVar9 = 8;
    do {
      iVar5 = rand();
      lVar10 = (long)(iVar5 % ((int)(uVar9 >> 3) + 1));
      if (uVar9 != lVar10 * 8) {
        ppVar6 = ppVar3 + lVar10;
        iVar5 = *(int *)((long)&ppVar3->first + uVar9);
        *(int *)((long)&ppVar3->first + uVar9) = ppVar6->first;
        ppVar6->first = iVar5;
        iVar5 = *(int *)((long)&ppVar3->second + uVar9);
        *(int *)((long)&ppVar3->second + uVar9) = ppVar6->second;
        ppVar6->second = iVar5;
      }
      ppVar6 = (pointer)((long)&ppVar3[1].first + uVar9);
      uVar9 = uVar9 + 8;
    } while (ppVar6 != ppVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

vector < pair<int, int> > IntensityILS::getShuffledCells(Station* s){
		 vector < pair<int, int> > cells;
		 for (int i=0; i<s->I.nb_rows();i++)
			 for (int j=0; j<s->I.nb_cols(); j++)
				 if(s->I(i,j)!=-1) cells.push_back(make_pair(i,j));
		 std::random_shuffle ( cells.begin(), cells.end(), myrandom);
		 return cells;
	 }